

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O1

Vec_Int_t * Pla_ManComputeDistance1Int(Pla_Man_t *p)

{
  int *piVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint Entry;
  int iVar;
  uint uVar5;
  Vec_Int_t *pVVar6;
  bool bVar7;
  uint uVar8;
  Vec_Int_t *vRes;
  int *piVar9;
  Vec_Int_t *vRes_00;
  Vec_Int_t *p_00;
  void *__s;
  Vec_Int_t *p_01;
  Tab_Man_t *pTab;
  Tab_Obj_t *pTVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  Tab_Obj_t *pTVar21;
  ulong local_88;
  
  vRes = (Vec_Int_t *)malloc(0x10);
  vRes->nCap = 100;
  vRes->nSize = 0;
  piVar9 = (int *)malloc(400);
  vRes->pArray = piVar9;
  vRes_00 = (Vec_Int_t *)malloc(0x10);
  vRes_00->nCap = 100;
  vRes_00->nSize = 0;
  piVar9 = (int *)malloc(400);
  vRes_00->pArray = piVar9;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar9 = (int *)malloc(4000);
  p_00->pArray = piVar9;
  uVar3 = (p->vCubeLits).nSize;
  lVar14 = (long)(int)uVar3;
  uVar19 = uVar3;
  if (uVar3 - 1 < 0xf) {
    uVar19 = 0x10;
  }
  if (uVar19 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar19 << 2);
  }
  uVar19 = 0;
  memset(__s,0,lVar14 * 4);
  iVar4 = p->nIns;
  p_01 = (Vec_Int_t *)malloc(0x10);
  if (iVar4 - 1U < 0xf) {
    iVar4 = 0x10;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar4;
  if (iVar4 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar4 << 2);
  }
  p_01->pArray = piVar9;
  if (0 < (int)uVar3) {
    lVar15 = 0;
    uVar19 = 0;
    do {
      uVar19 = uVar19 + *(int *)((long)&((p->vCubeLits).pArray)->nSize + lVar15);
      lVar15 = lVar15 + 0x10;
    } while (lVar14 << 4 != lVar15);
  }
  if (1 < uVar19) {
    uVar19 = uVar19 - 1;
    if (uVar19 == 0) {
      uVar19 = 0;
    }
    else {
      uVar8 = 0x1f;
      if (uVar19 != 0) {
        for (; uVar19 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar19 = (uVar8 ^ 0xffffffe0) + 0x21;
    }
  }
  if (0x18 < uVar19) {
    __assert_fail("nBits <= 26",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaHash.c"
                  ,0x115,"Vec_Int_t *Pla_ManComputeDistance1Int(Pla_Man_t *)");
  }
  pTab = (Tab_Man_t *)calloc(1,0x18);
  if (uVar19 < 2) {
    __assert_fail("LogSize >= 4 && LogSize <= 26",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaHash.c"
                  ,0x6e,"Tab_Man_t *Tab_ManAlloc(int, Pla_Man_t *)");
  }
  uVar19 = 4 << ((byte)uVar19 & 0x1f);
  pTab->SizeMask = uVar19 - 1;
  pTVar10 = (Tab_Obj_t *)calloc((ulong)uVar19,0x10);
  pTab->pBins = pTVar10;
  pTab->nBins = 1;
  pTab->pMan = p;
  Pla_ManHashCubes2(p,pTab);
  uVar19 = pTab->SizeMask;
  if (-1 < (int)uVar19) {
    pTVar10 = pTab->pBins;
    uVar8 = 0;
    do {
      p_01->nSize = 0;
      if ((pTVar10 != (Tab_Obj_t *)0x0) && (pTVar10[uVar19 & uVar8].Table != 0)) {
        pTVar21 = pTVar10 + pTVar10[uVar19 & uVar8].Table;
        do {
          uVar2 = *(ushort *)&pTVar21->field_0xc;
          Vec_IntPush(p_01,pTVar21->Cube);
          Vec_IntPush(p_01,(uint)uVar2);
          piVar9 = &pTVar21->Next;
          pTVar21 = pTVar10 + *piVar9;
          if ((long)*piVar9 == 0) {
            pTVar21 = (Tab_Obj_t *)0x0;
          }
        } while (pTVar21 != (Tab_Obj_t *)0x0);
      }
      uVar17 = (ulong)p_01->nSize;
      if (1 < (long)uVar17) {
        uVar18 = (ulong)((uint)p_01->nSize >> 1);
        local_88 = 1;
        uVar11 = 0;
        do {
          uVar12 = uVar11 + 1;
          if (uVar12 < uVar18) {
            if (uVar17 <= uVar11 * 2) {
LAB_0036ed48:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            piVar9 = p_01->pArray;
            uVar16 = local_88;
            do {
              if ((uVar17 <= uVar16 * 2) || (uVar13 = uVar16 * 2 | 1, uVar17 <= uVar13))
              goto LAB_0036ed48;
              uVar19 = piVar9[uVar11 * 2];
              if (((int)uVar19 < 0) || (iVar4 = (p->vCubeLits).nSize, iVar4 <= (int)uVar19)) {
LAB_0036ed29:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                              ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
              }
              Entry = piVar9[uVar16 * 2];
              uVar20 = (ulong)Entry;
              if (((int)Entry < 0) || (iVar4 <= (int)Entry)) goto LAB_0036ed29;
              pVVar6 = (p->vCubeLits).pArray;
              if (pVVar6[uVar19].nSize == pVVar6[uVar20].nSize) {
                iVar4 = piVar9[uVar11 * 2 | 1];
                iVar = piVar9[uVar13];
                Vec_IntCopySkip(pVVar6 + uVar19,iVar4,vRes);
                Vec_IntCopySkip(pVVar6 + uVar20,iVar,vRes_00);
                uVar5 = vRes->nSize;
                if (uVar5 == vRes_00->nSize) {
                  if (0 < (int)uVar5) {
                    uVar13 = 0;
                    do {
                      if (vRes->pArray[uVar13] != vRes_00->pArray[uVar13]) goto LAB_0036ebf2;
                      uVar13 = uVar13 + 1;
                    } while (uVar5 != uVar13);
                  }
                  printf("%d %d  ",(ulong)uVar19,(ulong)Entry);
                  Vec_IntPush(p_00,uVar19);
                  Vec_IntPush(p_00,iVar4);
                  Vec_IntPush(p_00,Entry);
                  Vec_IntPush(p_00,iVar);
                  if ((int)uVar3 <= (int)uVar19) {
LAB_0036ed67:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                  ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
                  }
                  piVar1 = (int *)((long)__s + (ulong)uVar19 * 4);
                  *piVar1 = *piVar1 + 1;
                  if ((int)uVar3 <= (int)Entry) goto LAB_0036ed67;
                  piVar1 = (int *)((long)__s + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                }
              }
LAB_0036ebf2:
              uVar16 = uVar16 + 1;
            } while (uVar16 < uVar18);
          }
          local_88 = local_88 + 1;
          uVar11 = uVar12;
        } while (uVar12 != uVar18);
      }
      uVar19 = pTab->SizeMask;
      bVar7 = (int)uVar8 < (int)uVar19;
      uVar8 = uVar8 + 1;
    } while (bVar7);
  }
  printf("Vector has %d entries: {",(ulong)uVar3);
  if (0 < (int)uVar3) {
    lVar15 = 0;
    do {
      printf(" %d",(ulong)*(uint *)((long)__s + lVar15 * 4));
      lVar15 = lVar15 + 1;
    } while (lVar14 != lVar15);
  }
  puts(" }");
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (vRes->pArray != (int *)0x0) {
    free(vRes->pArray);
    vRes->pArray = (int *)0x0;
  }
  free(vRes);
  if (vRes_00->pArray != (int *)0x0) {
    free(vRes_00->pArray);
    vRes_00->pArray = (int *)0x0;
  }
  free(vRes_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (pTab->pBins != (Tab_Obj_t *)0x0) {
    free(pTab->pBins);
    pTab->pBins = (Tab_Obj_t *)0x0;
  }
  free(pTab);
  return p_00;
}

Assistant:

Vec_Int_t * Pla_ManComputeDistance1Int( Pla_Man_t * p )
{
    Tab_Man_t * pTab;
    Vec_Int_t * vCube1, * vCube2;
    Vec_Int_t * vTemp1 = Vec_IntAlloc( 100 );
    Vec_Int_t * vTemp2 = Vec_IntAlloc( 100 );
    Vec_Int_t * vPairs = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCounts = Vec_IntStart( Vec_WecSize(&p->vCubeLits) );
    Vec_Int_t * vEntries = Vec_IntAlloc( p->nIns );
    int nBits = Abc_Base2Log( Vec_WecSizeSize(&p->vCubeLits) ) + 2;
    int v, i, k;//, Count = 0;
    int iCube1, iCube2, iVar1, iVar2;
    assert( nBits <= 26 );
    pTab = Tab_ManAlloc( nBits, p );
    //Pla_ManConvertFromBits( p );
    Pla_ManHashCubes2( p, pTab );
    // iterate through the hash bins
    for ( v = 0; v <= pTab->SizeMask; v++ )
    {
        Tab_ManHashCollect( pTab, v, vEntries );
        for ( i = 0; i < Vec_IntSize(vEntries)/2; i++ )
        for ( k = i+1; k < Vec_IntSize(vEntries)/2; k++ )
        {
            iCube1 = Vec_IntEntry(vEntries, 2*i);
            iCube2 = Vec_IntEntry(vEntries, 2*k);
            iVar1 = Vec_IntEntry(vEntries, 2*i+1);
            iVar2 = Vec_IntEntry(vEntries, 2*k+1);

            vCube1 = Vec_WecEntry(&p->vCubeLits, iCube1);
            vCube2 = Vec_WecEntry(&p->vCubeLits, iCube2);
/*
            Pla_PrintCube( vCube1, p->nIns, iVar1 );
            Pla_PrintCube( vCube2, p->nIns, iVar2 );
            printf( "\n" );
*/
            if ( Vec_IntSize(vCube1) != Vec_IntSize(vCube2) )
                continue;
            Vec_IntCopySkip( vCube1, iVar1, vTemp1 );
            Vec_IntCopySkip( vCube2, iVar2, vTemp2 );
            if ( !Vec_IntEqual( vTemp1, vTemp2 ) )
                continue;

            printf( "%d %d  ", iCube1, iCube2 );

            Vec_IntPushTwo( vPairs, iCube1, iVar1 );
            Vec_IntPushTwo( vPairs, iCube2, iVar2 );

            Vec_IntAddToEntry( vCounts, iCube1, 1 );
            Vec_IntAddToEntry( vCounts, iCube2, 1 );
        }
    }
    Vec_IntPrint( vCounts );

    Vec_IntFree( vCounts );
    Vec_IntFree( vTemp1 );
    Vec_IntFree( vTemp2 );
    Vec_IntFree( vEntries );
    Tab_ManFree( pTab );
    return vPairs;
}